

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O0

void __thiscall sc_core::vcd_trace::compose_data_line(vcd_trace *this,char *rawdata,char *compdata)

{
  char *pcVar1;
  undefined8 uVar2;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  char *effective_begin;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  if (in_RSI == in_RDX) {
    sc_assertion_failed(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
  }
  if (*(int *)(in_RDI + 0x4c) == 0) {
    *in_RDX = '\0';
  }
  else if (*(int *)(in_RDI + 0x4c) == 1) {
    *in_RDX = *in_RSI;
    pcVar1 = (char *)std::__cxx11::string::c_str();
    strcpy(in_RDX + 1,pcVar1);
  }
  else {
    pcVar1 = strip_leading_bits(in_stack_ffffffffffffffc8);
    uVar2 = std::__cxx11::string::c_str();
    sprintf(in_RDX,"b%s %s",pcVar1,uVar2);
  }
  return;
}

Assistant:

void
vcd_trace::compose_data_line(char* rawdata, char* compdata)
{
    sc_assert(rawdata != compdata);

    if(bit_width == 0)
    {
        compdata[0] = '\0';
    }
    else
    {
        if(bit_width == 1)
        {
            compdata[0] = rawdata[0];
            strcpy(&(compdata[1]), vcd_name.c_str());
        }
        else
        {
            const char* effective_begin = strip_leading_bits(rawdata);
            std::sprintf(compdata, "b%s %s", effective_begin, vcd_name.c_str());
        }
    }
}